

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor_function.hpp
# Opt level: O1

void __thiscall
asio::detail::executor_function::
executor_function<asio::detail::binder1<std::_Bind<void(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client*,std::_Placeholder<1>))(std::error_code_const&)>,std::error_code>,std::allocator<void>>
          (executor_function *this,
          binder1<std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::_Placeholder<1>))(const_std::error_code_&)>,_std::error_code>
          *f,allocator<void> *a)

{
  _func_void_impl_base_ptr_bool *p_Var1;
  error_category *peVar2;
  impl_base *piVar3;
  undefined8 uVar4;
  long *in_FS_OFFSET;
  ptr p;
  ptr local_28;
  
  if (*(long *)(*in_FS_OFFSET + -8) == 0) {
    uVar4 = 0;
  }
  else {
    uVar4 = *(undefined8 *)(*(long *)(*in_FS_OFFSET + -8) + 8);
  }
  local_28.a = a;
  piVar3 = (impl_base *)
           thread_info_base::allocate<asio::detail::thread_info_base::executor_function_tag>
                     (uVar4,0x38,8);
  local_28.p = (impl<asio::detail::binder1<std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::_Placeholder<1>))(const_std::error_code_&)>,_std::error_code>,_std::allocator<void>_>
                *)0x0;
  p_Var1 = *(_func_void_impl_base_ptr_bool **)&(f->handler_).field_0x8;
  piVar3[1].complete_ = (_func_void_impl_base_ptr_bool *)(f->handler_)._M_f;
  piVar3[2].complete_ = p_Var1;
  piVar3[3].complete_ =
       (_func_void_impl_base_ptr_bool *)
       (f->handler_)._M_bound_args.
       super__Tuple_impl<0UL,_nuraft::asio_rpc_client_*,_std::_Placeholder<1>_>.
       super__Head_base<0UL,_nuraft::asio_rpc_client_*,_false>._M_head_impl;
  peVar2 = (f->arg1_)._M_cat;
  piVar3[4].complete_ = *(_func_void_impl_base_ptr_bool **)&f->arg1_;
  piVar3[5].complete_ = (_func_void_impl_base_ptr_bool *)peVar2;
  piVar3->complete_ =
       complete<asio::detail::binder1<std::_Bind<void(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client*,std::_Placeholder<1>))(std::error_code_const&)>,std::error_code>,std::allocator<void>>
  ;
  this->impl_ = piVar3;
  local_28.v = (void *)0x0;
  impl<asio::detail::binder1<std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::_Placeholder<1>))(const_std::error_code_&)>,_std::error_code>,_std::allocator<void>_>
  ::ptr::reset(&local_28);
  return;
}

Assistant:

explicit executor_function(F f, const Alloc& a)
  {
    // Allocate and construct an object to wrap the function.
    typedef impl<F, Alloc> impl_type;
    typename impl_type::ptr p = {
      detail::addressof(a), impl_type::ptr::allocate(a), 0 };
    impl_ = new (p.v) impl_type(ASIO_MOVE_CAST(F)(f), a);
    p.v = 0;
  }